

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O2

void __thiscall Scene::~Scene(Scene *this)

{
  Camera *this_00;
  pointer ppLVar1;
  pointer ppOVar2;
  pointer ppOVar3;
  pointer ppLVar4;
  
  this_00 = this->m_camera;
  if (this_00 != (Camera *)0x0) {
    Camera::~Camera(this_00);
    operator_delete(this_00);
  }
  ppLVar1 = (this->m_lights).super__Vector_base<Light_*,_std::allocator<Light_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppLVar4 = (this->m_lights).super__Vector_base<Light_*,_std::allocator<Light_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppLVar4 != ppLVar1; ppLVar4 = ppLVar4 + 1) {
    if (*ppLVar4 != (Light *)0x0) {
      (*(*ppLVar4)->_vptr_Light[1])();
    }
  }
  ppOVar2 = (this->m_objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppOVar3 = (this->m_objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppOVar3 != ppOVar2; ppOVar3 = ppOVar3 + 1) {
    if (*ppOVar3 != (Object *)0x0) {
      (*(*ppOVar3)->_vptr_Object[1])();
    }
  }
  ppLVar4 = (this->m_lights).super__Vector_base<Light_*,_std::allocator<Light_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_lights).super__Vector_base<Light_*,_std::allocator<Light_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppLVar4) {
    (this->m_lights).super__Vector_base<Light_*,_std::allocator<Light_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppLVar4;
  }
  ppOVar3 = (this->m_objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppOVar3) {
    (this->m_objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppOVar3;
  }
  std::_Vector_base<Object_*,_std::allocator<Object_*>_>::~_Vector_base
            (&(this->m_objects).super__Vector_base<Object_*,_std::allocator<Object_*>_>);
  std::_Vector_base<Light_*,_std::allocator<Light_*>_>::~_Vector_base
            (&(this->m_lights).super__Vector_base<Light_*,_std::allocator<Light_*>_>);
  return;
}

Assistant:

Scene::~Scene()
{
    if (m_camera) delete m_camera;
    for (auto i : m_lights) delete i;
    for (auto i : m_objects) delete i;
    m_lights.clear();
    m_objects.clear();
}